

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscall_file.cpp
# Opt level: O1

void __thiscall
foxxll::syscall_file::serve
          (syscall_file *this,void *buffer,offset_type offset,size_type bytes,read_or_write op)

{
  int __fd;
  __off64_t _Var1;
  ssize_t sVar2;
  offset_type oVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  io_error *piVar7;
  scoped_read_write_timer read_write_timer;
  unique_lock<std::mutex> fd_lock;
  ostringstream msg;
  string local_1e8;
  scoped_read_write_timer local_1c8;
  unique_lock<std::mutex> local_1b8;
  ostringstream local_1a8 [376];
  
  local_1b8._M_device = &(this->super_ufs_file_base).fd_mutex_;
  local_1b8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_1b8);
  local_1b8._M_owns = true;
  local_1c8.file_stats_ = *(file_stats **)&this->field_0x88;
  local_1c8.is_write_ = op == WRITE;
  local_1c8.running_ = false;
  file_stats::scoped_read_write_timer::start(&local_1c8,bytes);
  if (bytes != 0) {
    do {
      _Var1 = lseek64((this->super_ufs_file_base).file_des_,offset,0);
      if (_Var1 < 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error in ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "virtual void foxxll::syscall_file::serve(void *, offset_type, size_type, request::read_or_write)"
                   ,0x60);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," this=",6);
        poVar4 = std::ostream::_M_insert<void_const*>(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," call=::lseek(fd,offset,SEEK_SET)",0x21);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," path=",6);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(this->super_ufs_file_base).filename_._M_dataplus._M_p,
                            (this->super_ufs_file_base).filename_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," fd=",4);
        poVar4 = (ostream *)
                 std::ostream::operator<<((ostream *)poVar4,(this->super_ufs_file_base).file_des_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," offset=",8);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," buffer=",8);
        poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes=",7);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," op=",4);
        pcVar6 = "WRITE";
        if (op == READ) {
          pcVar6 = "READ";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,(ulong)(op == READ) ^ 5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," rc=",4);
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        std::operator<<(poVar4,pcVar6);
        piVar7 = (io_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::stringbuf::str();
        io_error::io_error(piVar7,&local_1e8);
        __cxa_throw(piVar7,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
      __fd = (this->super_ufs_file_base).file_des_;
      if (op == READ) {
        sVar2 = read(__fd,buffer,bytes);
        if (sVar2 < 1) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error in ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "virtual void foxxll::syscall_file::serve(void *, offset_type, size_type, request::read_or_write)"
                     ,0x60);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," this=",6);
          poVar4 = std::ostream::_M_insert<void_const*>(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," call=::read(fd,buffer,bytes)",0x1d);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," path=",6);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,(this->super_ufs_file_base).filename_._M_dataplus._M_p,
                              (this->super_ufs_file_base).filename_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," fd=",4);
          poVar4 = (ostream *)
                   std::ostream::operator<<((ostream *)poVar4,(this->super_ufs_file_base).file_des_)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," offset=",8);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," buffer=",8);
          poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes=",7);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," op=",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"READ",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," rc=",4);
          poVar4 = std::ostream::_M_insert<long>((long)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          std::operator<<(poVar4,pcVar6);
          piVar7 = (io_error *)__cxa_allocate_exception(0x20);
          std::__cxx11::stringbuf::str();
          io_error::io_error(piVar7,&local_1e8);
          __cxa_throw(piVar7,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
        }
        offset = offset + sVar2;
        buffer = (void *)((long)buffer + sVar2);
        bytes = bytes - sVar2;
        if (bytes != 0) {
          oVar3 = ufs_file_base::_size(&this->super_ufs_file_base);
          if (offset != oVar3) goto LAB_00141174;
          memset(buffer,0,bytes);
        }
        bytes = 0;
      }
      else {
        sVar2 = write(__fd,buffer,bytes);
        if (sVar2 < 1) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error in ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "virtual void foxxll::syscall_file::serve(void *, offset_type, size_type, request::read_or_write)"
                     ,0x60);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," this=",6);
          poVar4 = std::ostream::_M_insert<void_const*>(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," call=::write(fd,buffer,bytes)",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," path=",6);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,(this->super_ufs_file_base).filename_._M_dataplus._M_p,
                              (this->super_ufs_file_base).filename_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," fd=",4);
          poVar4 = (ostream *)
                   std::ostream::operator<<((ostream *)poVar4,(this->super_ufs_file_base).file_des_)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," offset=",8);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," buffer=",8);
          poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes=",7);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," op=",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"WRITE",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," rc=",4);
          poVar4 = std::ostream::_M_insert<long>((long)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          std::operator<<(poVar4,pcVar6);
          piVar7 = (io_error *)__cxa_allocate_exception(0x20);
          std::__cxx11::stringbuf::str();
          io_error::io_error(piVar7,&local_1e8);
          __cxa_throw(piVar7,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
        }
        bytes = bytes - sVar2;
        offset = offset + sVar2;
        buffer = (void *)((long)buffer + sVar2);
      }
LAB_00141174:
    } while (bytes != 0);
  }
  if (local_1c8.running_ == true) {
    if (local_1c8.is_write_ == true) {
      file_stats::write_finished(local_1c8.file_stats_);
    }
    else {
      file_stats::read_finished(local_1c8.file_stats_);
    }
    local_1c8.running_ = false;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_1b8);
  return;
}

Assistant:

void syscall_file::serve(void* buffer, offset_type offset, size_type bytes,
                         request::read_or_write op)
{
    std::unique_lock<std::mutex> fd_lock(fd_mutex_);

    auto* cbuffer = static_cast<char*>(buffer);

    file_stats::scoped_read_write_timer read_write_timer(
        file_stats_, bytes, op == request::WRITE);

    while (bytes > 0)
    {
        off_t rc = ::lseek(file_des_, offset, SEEK_SET);
        if (rc < 0)
        {
            FOXXLL_THROW_ERRNO(
                io_error,
                " this=" << this <<
                    " call=::lseek(fd,offset,SEEK_SET)" <<
                    " path=" << filename_ <<
                    " fd=" << file_des_ <<
                    " offset=" << offset <<
                    " buffer=" << static_cast<void*>(cbuffer) <<
                    " bytes=" << bytes <<
                    " op=" << ((op == request::READ) ? "READ" : "WRITE") <<
                    " rc=" << rc
            );
        }

        if (op == request::READ)
        {
#if FOXXLL_MSVC
            assert(bytes <= std::numeric_limits<unsigned int>::max());
            if ((rc = ::read(file_des_, cbuffer, (unsigned int)bytes)) <= 0)
#else
            if ((rc = ::read(file_des_, cbuffer, bytes)) <= 0)
#endif
            {
                FOXXLL_THROW_ERRNO(
                    io_error,
                    " this=" << this <<
                        " call=::read(fd,buffer,bytes)" <<
                        " path=" << filename_ <<
                        " fd=" << file_des_ <<
                        " offset=" << offset <<
                        " buffer=" << static_cast<void*>(buffer) <<
                        " bytes=" << bytes <<
                        " op=" << "READ" <<
                        " rc=" << rc
                );
            }
            bytes = static_cast<size_type>(bytes - rc);
            offset += rc;
            cbuffer += rc;

            if (bytes > 0 && offset == this->_size())
            {
                // read request extends past end-of-file
                // fill reminder with zeroes
                memset(cbuffer, 0, bytes);
                bytes = 0;
            }
        }
        else
        {
#if FOXXLL_MSVC
            assert(bytes <= std::numeric_limits<unsigned int>::max());
            if ((rc = ::write(file_des_, cbuffer, (unsigned int)bytes)) <= 0)
#else
            if ((rc = ::write(file_des_, cbuffer, bytes)) <= 0)
#endif
            {
                FOXXLL_THROW_ERRNO(
                    io_error,
                    " this=" << this <<
                        " call=::write(fd,buffer,bytes)" <<
                        " path=" << filename_ <<
                        " fd=" << file_des_ <<
                        " offset=" << offset <<
                        " buffer=" << static_cast<void*>(buffer) <<
                        " bytes=" << bytes <<
                        " op=" << "WRITE" <<
                        " rc=" << rc
                );
            }
            bytes = static_cast<size_type>(bytes - rc);
            offset += rc;
            cbuffer += rc;
        }
    }
}